

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttpthreaddelegate_p.cpp
# Opt level: O2

void QHttpThreadDelegate::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int _t2;
  QHttpHeaders *_t1;
  QString *_t3;
  QSharedPointer<char> _t5;
  bool bVar1;
  undefined8 *puVar2;
  InterfaceType *pIVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  bool in_stack_ffffffffffffffb8;
  undefined8 local_30;
  Data *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    switch(_id) {
    case 0:
    case 0x1d:
    case 0x21:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QHttpNetworkRequest>::metaType;
LAB_001fb243:
        *puVar2 = pIVar3;
        goto switchD_001fafe1_default;
      }
      break;
    case 1:
    case 0x22:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkProxy>::metaType;
        goto LAB_001fb243;
      }
      break;
    default:
      puVar2 = (undefined8 *)*_a;
      break;
    case 3:
    case 0x1f:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
        goto LAB_001fb243;
      }
      break;
    case 4:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslConfiguration>::metaType;
        goto LAB_001fb243;
      }
      break;
    case 5:
    case 0x20:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType;
        goto LAB_001fb243;
      }
      break;
    case 0xb:
    case 0x15:
    case 0x16:
    case 0x18:
    case 0x19:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
        goto LAB_001fb243;
      }
    }
    *puVar2 = 0;
    goto switchD_001fafe1_default;
  }
  if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::
            indexOfMethod<void(QHttpThreadDelegate::*)(QHttpNetworkRequest_const&,QAuthenticator*)>
                      ((QtMocHelpers *)_a,(void **)authenticationRequired,0,0);
    if (((((!bVar1) &&
          (bVar1 = QtMocHelpers::
                   indexOfMethod<void(QHttpThreadDelegate::*)(QNetworkProxy_const&,QAuthenticator*)>
                             ((QtMocHelpers *)_a,(void **)proxyAuthenticationRequired,0,1), !bVar1))
         && (bVar1 = QtMocHelpers::indexOfMethod<void(QHttpThreadDelegate::*)()>
                               ((QtMocHelpers *)_a,(void **)encrypted,0,2), !bVar1)) &&
        (((bVar1 = QtMocHelpers::
                   indexOfMethod<void(QHttpThreadDelegate::*)(QList<QSslError>const&,bool*,QList<QSslError>*)>
                             ((QtMocHelpers *)_a,(void **)sslErrors,0,3), !bVar1 &&
          (bVar1 = QtMocHelpers::
                   indexOfMethod<void(QHttpThreadDelegate::*)(QSslConfiguration_const&)>
                             ((QtMocHelpers *)_a,(void **)sslConfigurationChanged,0,4), !bVar1)) &&
         ((bVar1 = QtMocHelpers::
                   indexOfMethod<void(QHttpThreadDelegate::*)(QSslPreSharedKeyAuthenticator*)>
                             ((QtMocHelpers *)_a,(void **)preSharedKeyAuthenticationRequired,0,5),
          !bVar1 && ((bVar1 = QtMocHelpers::indexOfMethod<void(QHttpThreadDelegate::*)()>
                                        ((QtMocHelpers *)_a,(void **)socketStartedConnecting,0,6),
                     !bVar1 && (bVar1 = QtMocHelpers::indexOfMethod<void(QHttpThreadDelegate::*)()>
                                                  ((QtMocHelpers *)_a,(void **)requestSent,0,7),
                               !bVar1)))))))) &&
       ((bVar1 = QtMocHelpers::
                 indexOfMethod<void(QHttpThreadDelegate::*)(QHttpHeaders_const&,int,QString_const&,bool,QSharedPointer<char>,long_long,long_long,bool,bool)>
                           ((QtMocHelpers *)_a,(void **)downloadMetaData,0,8), !bVar1 &&
        ((((bVar1 = QtMocHelpers::indexOfMethod<void(QHttpThreadDelegate::*)(long_long,long_long)>
                              ((QtMocHelpers *)_a,(void **)downloadProgress,0,9), !bVar1 &&
           (bVar1 = QtMocHelpers::indexOfMethod<void(QHttpThreadDelegate::*)(QByteArray_const&)>
                              ((QtMocHelpers *)_a,(void **)downloadData,0,10), !bVar1)) &&
          (bVar1 = QtMocHelpers::
                   indexOfMethod<void(QHttpThreadDelegate::*)(QNetworkReply::NetworkError,QString_const&)>
                             ((QtMocHelpers *)_a,(void **)error,0,0xb), !bVar1)) &&
         (bVar1 = QtMocHelpers::indexOfMethod<void(QHttpThreadDelegate::*)()>
                            ((QtMocHelpers *)_a,(void **)downloadFinished,0,0xc), !bVar1)))))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QtMocHelpers::indexOfMethod<void(QHttpThreadDelegate::*)(QUrl_const&,int,int)>
                  ((QtMocHelpers *)_a,(void **)redirected,0,0xd);
        return;
      }
      goto LAB_001fb7f6;
    }
    goto switchD_001fafe1_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_001fafe1_default;
  switch(_id) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      authenticationRequired((QHttpThreadDelegate *)_o,(QHttpNetworkRequest *)_a[1],*_a[2]);
      return;
    }
    break;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      proxyAuthenticationRequired((QHttpThreadDelegate *)_o,(QNetworkProxy *)_a[1],*_a[2]);
      return;
    }
    break;
  case 2:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      encrypted((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      sslErrors((QHttpThreadDelegate *)_o,(QList<QSslError> *)_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      sslConfigurationChanged((QHttpThreadDelegate *)_o,(QSslConfiguration *)_a[1]);
      return;
    }
    break;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      preSharedKeyAuthenticationRequired((QHttpThreadDelegate *)_o,*_a[1]);
      return;
    }
    break;
  case 6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      socketStartedConnecting((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 7:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      requestSent((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 8:
    _t1 = (QHttpHeaders *)_a[1];
    _t2 = *_a[2];
    _t3 = (QString *)_a[3];
    bVar1 = *_a[4];
    local_30 = *_a[5];
    local_28 = *(Data **)((long)_a[5] + 8);
    if (local_28 != (Data *)0x0) {
      LOCK();
      (local_28->weakref)._q_value.super___atomic_base<int>._M_i =
           (local_28->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (local_28->strongref)._q_value.super___atomic_base<int>._M_i =
           (local_28->strongref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    _t5.d = *_a[7];
    _t5.value.ptr = *_a[6];
    downloadMetaData((QHttpThreadDelegate *)_o,_t1,_t2,_t3,bVar1,_t5,(qint64)&local_30,(ulong)*_a[8]
                     ,*_a[9],in_stack_ffffffffffffffb8);
    QSharedPointer<char>::deref(local_28);
  default:
switchD_001fafe1_default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
    break;
  case 9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      downloadProgress((QHttpThreadDelegate *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      downloadData((QHttpThreadDelegate *)_o,(QByteArray *)_a[1]);
      return;
    }
    break;
  case 0xb:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      error((QHttpThreadDelegate *)_o,*_a[1],(QString *)_a[2]);
      return;
    }
    break;
  case 0xc:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      downloadFinished((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 0xd:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      redirected((QHttpThreadDelegate *)_o,(QUrl *)_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 0xe:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      startRequest((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 0xf:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      abortRequest((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 0x10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      readBufferSizeChanged((QHttpThreadDelegate *)_o,*_a[1]);
      return;
    }
    break;
  case 0x11:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      readBufferFreed((QHttpThreadDelegate *)_o,*_a[1]);
      return;
    }
    break;
  case 0x12:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      startRequestSynchronously((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 0x13:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      readyReadSlot((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 0x14:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      finishedSlot((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 0x15:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      finishedWithErrorSlot((QHttpThreadDelegate *)_o,*_a[1],(QString *)_a[2]);
      return;
    }
    break;
  case 0x16:
    finishedWithErrorSlot((QHttpThreadDelegate *)_o,*_a[1],(QString *)&stack0xffffffffffffffb8);
    goto LAB_001fb732;
  case 0x17:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      synchronousFinishedSlot((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 0x18:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      synchronousFinishedWithErrorSlot((QHttpThreadDelegate *)_o,*_a[1],(QString *)_a[2]);
      return;
    }
    break;
  case 0x19:
    synchronousFinishedWithErrorSlot
              ((QHttpThreadDelegate *)_o,*_a[1],(QString *)&stack0xffffffffffffffb8);
LAB_001fb732:
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffb8);
    goto switchD_001fafe1_default;
  case 0x1a:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      headerChangedSlot((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 0x1b:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      synchronousHeaderChangedSlot((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 0x1c:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      dataReadProgressSlot((QHttpThreadDelegate *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 0x1d:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      cacheCredentialsSlot((QHttpThreadDelegate *)_o,(QHttpNetworkRequest *)_a[1],*_a[2]);
      return;
    }
    break;
  case 0x1e:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      encryptedSlot((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 0x1f:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      sslErrorsSlot((QHttpThreadDelegate *)_o,(QList<QSslError> *)_a[1]);
      return;
    }
    break;
  case 0x20:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      preSharedKeyAuthenticationRequiredSlot((QHttpThreadDelegate *)_o,*_a[1]);
      return;
    }
    break;
  case 0x21:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      synchronousAuthenticationRequiredSlot
                ((QHttpThreadDelegate *)_o,(QHttpNetworkRequest *)CONCAT44(in_register_00000034,_c),
                 *_a[2]);
      return;
    }
    break;
  case 0x22:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      synchronousProxyAuthenticationRequiredSlot
                ((QHttpThreadDelegate *)_o,(QNetworkProxy *)_a[1],*_a[2]);
      return;
    }
  }
LAB_001fb7f6:
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QHttpThreadDelegate *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->authenticationRequired((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 1: _t->proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 2: _t->encrypted(); break;
        case 3: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool*>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<QSslError>*>>(_a[3]))); break;
        case 4: _t->sslConfigurationChanged((*reinterpret_cast< std::add_pointer_t<QSslConfiguration>>(_a[1]))); break;
        case 5: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 6: _t->socketStartedConnecting(); break;
        case 7: _t->requestSent(); break;
        case 8: _t->downloadMetaData((*reinterpret_cast< std::add_pointer_t<QHttpHeaders>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<QSharedPointer<char>>>(_a[5])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[6])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[7])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[8])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[9]))); break;
        case 9: _t->downloadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 10: _t->downloadData((*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[1]))); break;
        case 11: _t->error((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 12: _t->downloadFinished(); break;
        case 13: _t->redirected((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 14: _t->startRequest(); break;
        case 15: _t->abortRequest(); break;
        case 16: _t->readBufferSizeChanged((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 17: _t->readBufferFreed((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 18: _t->startRequestSynchronously(); break;
        case 19: _t->readyReadSlot(); break;
        case 20: _t->finishedSlot(); break;
        case 21: _t->finishedWithErrorSlot((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 22: _t->finishedWithErrorSlot((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1]))); break;
        case 23: _t->synchronousFinishedSlot(); break;
        case 24: _t->synchronousFinishedWithErrorSlot((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 25: _t->synchronousFinishedWithErrorSlot((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1]))); break;
        case 26: _t->headerChangedSlot(); break;
        case 27: _t->synchronousHeaderChangedSlot(); break;
        case 28: _t->dataReadProgressSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 29: _t->cacheCredentialsSlot((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 30: _t->encryptedSlot(); break;
        case 31: _t->sslErrorsSlot((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 32: _t->preSharedKeyAuthenticationRequiredSlot((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 33: _t->synchronousAuthenticationRequiredSlot((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 34: _t->synchronousProxyAuthenticationRequiredSlot((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkProxy >(); break;
            }
            break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslConfiguration >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 11:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 21:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 22:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 24:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 25:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 29:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 31:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 32:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 33:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 34:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkProxy >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QHttpNetworkRequest & , QAuthenticator * )>(_a, &QHttpThreadDelegate::authenticationRequired, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QNetworkProxy & , QAuthenticator * )>(_a, &QHttpThreadDelegate::proxyAuthenticationRequired, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)()>(_a, &QHttpThreadDelegate::encrypted, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QList<QSslError> & , bool * , QList<QSslError> * )>(_a, &QHttpThreadDelegate::sslErrors, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QSslConfiguration & )>(_a, &QHttpThreadDelegate::sslConfigurationChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QHttpThreadDelegate::preSharedKeyAuthenticationRequired, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)()>(_a, &QHttpThreadDelegate::socketStartedConnecting, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)()>(_a, &QHttpThreadDelegate::requestSent, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QHttpHeaders & , int , const QString & , bool , QSharedPointer<char> , qint64 , qint64 , bool , bool )>(_a, &QHttpThreadDelegate::downloadMetaData, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(qint64 , qint64 )>(_a, &QHttpThreadDelegate::downloadProgress, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QByteArray & )>(_a, &QHttpThreadDelegate::downloadData, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(QNetworkReply::NetworkError , const QString & )>(_a, &QHttpThreadDelegate::error, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)()>(_a, &QHttpThreadDelegate::downloadFinished, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QUrl & , int , int )>(_a, &QHttpThreadDelegate::redirected, 13))
            return;
    }
}